

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O3

double GetUDMFFloat(int type,int index,char *key)

{
  Node *pNVar1;
  Node *pNVar2;
  FUDMFKey *pFVar3;
  double dVar4;
  FName local_c;
  
  if (3 < (uint)type) {
    __assert_fail("type >=0 && type <=3",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_udmf.cpp"
                  ,0x166,"double GetUDMFFloat(int, int, const char *)");
  }
  pNVar1 = UDMFKeys[(uint)type].Nodes + (UDMFKeys[(uint)type].Size - 1 & index);
  while( true ) {
    pNVar2 = pNVar1;
    if (pNVar2 == (Node *)0x0) {
      return 0.0;
    }
    if (pNVar2->Next == (Node *)0x1) break;
    pNVar1 = pNVar2->Next;
    if ((pNVar2->Pair).Key == index) {
      local_c.Index = FName::NameManager::FindName(&FName::NameData,key,false);
      pFVar3 = FUDMFKeys::Find(&(pNVar2->Pair).Value,&local_c);
      dVar4 = 0.0;
      if (pFVar3 != (FUDMFKey *)0x0) {
        dVar4 = pFVar3->FloatVal;
      }
      return dVar4;
    }
  }
  return 0.0;
}

Assistant:

double GetUDMFFloat(int type, int index, const char *key)
{
	assert(type >=0 && type <=3);

	FUDMFKeys *pKeys = UDMFKeys[type].CheckKey(index);

	if (pKeys != NULL)
	{
		FUDMFKey *pKey = pKeys->Find(key);
		if (pKey != NULL)
		{
			return pKey->FloatVal;
		}
	}
	return 0;
}